

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_double_jac(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_ecp_point *P)

{
  int iVar1;
  bool bVar2;
  undefined1 local_88 [8];
  mbedtls_mpi U;
  mbedtls_mpi T;
  mbedtls_mpi S;
  mbedtls_mpi M;
  int ret;
  mbedtls_ecp_point *P_local;
  mbedtls_ecp_point *R_local;
  mbedtls_ecp_group *grp_local;
  
  dbl_count = dbl_count + 1;
  mbedtls_mpi_init((mbedtls_mpi *)&S.p);
  mbedtls_mpi_init((mbedtls_mpi *)&T.p);
  mbedtls_mpi_init((mbedtls_mpi *)&U.p);
  mbedtls_mpi_init((mbedtls_mpi *)local_88);
  if ((grp->A).p == (mbedtls_mpi_uint *)0x0) {
    M.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&T.p,&P->Z,&P->Z);
    if ((M.p._4_4_ == 0) && (M.p._4_4_ = ecp_modp((mbedtls_mpi *)&T.p,grp), M.p._4_4_ == 0)) {
      mul_count = mul_count + 1;
      M.p._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)&U.p,&P->X,(mbedtls_mpi *)&T.p);
      while (M.p._4_4_ == 0) {
        iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&U.p,&grp->P);
        if (iVar1 < 0) {
          M.p._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)local_88,&P->X,(mbedtls_mpi *)&T.p);
          goto joined_r0x0014b6e2;
        }
        M.p._4_4_ = mbedtls_mpi_sub_abs((mbedtls_mpi *)&U.p,(mbedtls_mpi *)&U.p,&grp->P);
      }
    }
  }
  else {
    M.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&T.p,&P->X,&P->X);
    if ((M.p._4_4_ == 0) && (M.p._4_4_ = ecp_modp((mbedtls_mpi *)&T.p,grp), M.p._4_4_ == 0)) {
      mul_count = mul_count + 1;
      M.p._4_4_ = mbedtls_mpi_mul_int((mbedtls_mpi *)&S.p,(mbedtls_mpi *)&T.p,3);
      while (M.p._4_4_ == 0) {
        iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&S.p,&grp->P);
        if (iVar1 < 0) {
          iVar1 = mbedtls_mpi_cmp_int(&grp->A,0);
          if (iVar1 == 0) goto LAB_0014ba3d;
          M.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&T.p,&P->Z,&P->Z);
          if ((M.p._4_4_ == 0) && (M.p._4_4_ = ecp_modp((mbedtls_mpi *)&T.p,grp), M.p._4_4_ == 0)) {
            mul_count = mul_count + 1;
            M.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&U.p,(mbedtls_mpi *)&T.p,
                                            (mbedtls_mpi *)&T.p);
            if ((M.p._4_4_ == 0) && (M.p._4_4_ = ecp_modp((mbedtls_mpi *)&U.p,grp), M.p._4_4_ == 0))
            {
              mul_count = mul_count + 1;
              M.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&T.p,(mbedtls_mpi *)&U.p,&grp->A);
              if ((M.p._4_4_ == 0) &&
                 (M.p._4_4_ = ecp_modp((mbedtls_mpi *)&T.p,grp), M.p._4_4_ == 0)) {
                mul_count = mul_count + 1;
                M.p._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)&S.p,(mbedtls_mpi *)&S.p,
                                                (mbedtls_mpi *)&T.p);
                goto joined_r0x0014b9f1;
              }
            }
          }
          break;
        }
        M.p._4_4_ = mbedtls_mpi_sub_abs((mbedtls_mpi *)&S.p,(mbedtls_mpi *)&S.p,&grp->P);
      }
    }
  }
  goto LAB_0014c006;
joined_r0x0014b6e2:
  if (M.p._4_4_ != 0) goto LAB_0014c006;
  bVar2 = false;
  if ((int)local_88._0_4_ < 0) {
    iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)local_88,0);
    bVar2 = iVar1 != 0;
  }
  if (!bVar2) {
    M.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&T.p,(mbedtls_mpi *)&U.p,(mbedtls_mpi *)local_88)
    ;
    if ((M.p._4_4_ == 0) && (M.p._4_4_ = ecp_modp((mbedtls_mpi *)&T.p,grp), M.p._4_4_ == 0)) {
      mul_count = mul_count + 1;
      M.p._4_4_ = mbedtls_mpi_mul_int((mbedtls_mpi *)&S.p,(mbedtls_mpi *)&T.p,3);
      goto joined_r0x0014b7b5;
    }
    goto LAB_0014c006;
  }
  M.p._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)local_88,(mbedtls_mpi *)local_88,&grp->P);
  goto joined_r0x0014b6e2;
joined_r0x0014b7b5:
  if (M.p._4_4_ != 0) goto LAB_0014c006;
  iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&S.p,&grp->P);
  if (iVar1 < 0) goto LAB_0014ba3d;
  M.p._4_4_ = mbedtls_mpi_sub_abs((mbedtls_mpi *)&S.p,(mbedtls_mpi *)&S.p,&grp->P);
  goto joined_r0x0014b7b5;
joined_r0x0014b9f1:
  if (M.p._4_4_ != 0) goto LAB_0014c006;
  iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&S.p,&grp->P);
  if (iVar1 < 0) goto LAB_0014ba3d;
  M.p._4_4_ = mbedtls_mpi_sub_abs((mbedtls_mpi *)&S.p,(mbedtls_mpi *)&S.p,&grp->P);
  goto joined_r0x0014b9f1;
joined_r0x0014bb61:
  if (M.p._4_4_ != 0) goto LAB_0014c006;
  iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&T.p,&grp->P);
  if (iVar1 < 0) {
    M.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)local_88,(mbedtls_mpi *)&U.p,(mbedtls_mpi *)&U.p)
    ;
    if ((M.p._4_4_ == 0) && (M.p._4_4_ = ecp_modp((mbedtls_mpi *)local_88,grp), M.p._4_4_ == 0)) {
      mul_count = mul_count + 1;
      M.p._4_4_ = mbedtls_mpi_shift_l((mbedtls_mpi *)local_88,1);
      goto joined_r0x0014bc12;
    }
    goto LAB_0014c006;
  }
  M.p._4_4_ = mbedtls_mpi_sub_abs((mbedtls_mpi *)&T.p,(mbedtls_mpi *)&T.p,&grp->P);
  goto joined_r0x0014bb61;
joined_r0x0014bc12:
  if (M.p._4_4_ != 0) goto LAB_0014c006;
  iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)local_88,&grp->P);
  if (iVar1 < 0) {
    M.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&U.p,(mbedtls_mpi *)&S.p,(mbedtls_mpi *)&S.p);
    if ((M.p._4_4_ == 0) && (M.p._4_4_ = ecp_modp((mbedtls_mpi *)&U.p,grp), M.p._4_4_ == 0)) {
      mul_count = mul_count + 1;
      M.p._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&U.p,(mbedtls_mpi *)&U.p,(mbedtls_mpi *)&T.p);
      goto joined_r0x0014bcc5;
    }
    goto LAB_0014c006;
  }
  M.p._4_4_ = mbedtls_mpi_sub_abs((mbedtls_mpi *)local_88,(mbedtls_mpi *)local_88,&grp->P);
  goto joined_r0x0014bc12;
joined_r0x0014bcc5:
  if (M.p._4_4_ != 0) goto LAB_0014c006;
  bVar2 = false;
  if ((int)U.p < 0) {
    iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&U.p,0);
    bVar2 = iVar1 != 0;
  }
  if (!bVar2) {
    M.p._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&U.p,(mbedtls_mpi *)&U.p,(mbedtls_mpi *)&T.p);
    goto joined_r0x0014bd42;
  }
  M.p._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)&U.p,(mbedtls_mpi *)&U.p,&grp->P);
  goto joined_r0x0014bcc5;
joined_r0x0014bd42:
  if (M.p._4_4_ != 0) goto LAB_0014c006;
  bVar2 = false;
  if ((int)U.p < 0) {
    iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&U.p,0);
    bVar2 = iVar1 != 0;
  }
  if (!bVar2) {
    M.p._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&T.p,(mbedtls_mpi *)&T.p,(mbedtls_mpi *)&U.p);
    goto joined_r0x0014bdbf;
  }
  M.p._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)&U.p,(mbedtls_mpi *)&U.p,&grp->P);
  goto joined_r0x0014bd42;
joined_r0x0014bdbf:
  if (M.p._4_4_ != 0) goto LAB_0014c006;
  bVar2 = false;
  if ((int)T.p < 0) {
    iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&T.p,0);
    bVar2 = iVar1 != 0;
  }
  if (!bVar2) {
    M.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&T.p,(mbedtls_mpi *)&T.p,(mbedtls_mpi *)&S.p);
    if ((M.p._4_4_ == 0) && (M.p._4_4_ = ecp_modp((mbedtls_mpi *)&T.p,grp), M.p._4_4_ == 0)) {
      mul_count = mul_count + 1;
      M.p._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&T.p,(mbedtls_mpi *)&T.p,
                                      (mbedtls_mpi *)local_88);
      goto joined_r0x0014be8f;
    }
    goto LAB_0014c006;
  }
  M.p._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)&T.p,(mbedtls_mpi *)&T.p,&grp->P);
  goto joined_r0x0014bdbf;
joined_r0x0014be8f:
  if (M.p._4_4_ != 0) goto LAB_0014c006;
  bVar2 = false;
  if ((int)T.p < 0) {
    iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&T.p,0);
    bVar2 = iVar1 != 0;
  }
  if (!bVar2) {
    M.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)local_88,&P->Y,&P->Z);
    if ((M.p._4_4_ == 0) && (M.p._4_4_ = ecp_modp((mbedtls_mpi *)local_88,grp), M.p._4_4_ == 0)) {
      mul_count = mul_count + 1;
      M.p._4_4_ = mbedtls_mpi_shift_l((mbedtls_mpi *)local_88,1);
      goto joined_r0x0014bf66;
    }
    goto LAB_0014c006;
  }
  M.p._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)&T.p,(mbedtls_mpi *)&T.p,&grp->P);
  goto joined_r0x0014be8f;
joined_r0x0014bf66:
  if (M.p._4_4_ != 0) goto LAB_0014c006;
  iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)local_88,&grp->P);
  if (iVar1 < 0) {
    M.p._4_4_ = mbedtls_mpi_copy(&R->X,(mbedtls_mpi *)&U.p);
    if ((M.p._4_4_ == 0) &&
       (M.p._4_4_ = mbedtls_mpi_copy(&R->Y,(mbedtls_mpi *)&T.p), M.p._4_4_ == 0)) {
      M.p._4_4_ = mbedtls_mpi_copy(&R->Z,(mbedtls_mpi *)local_88);
    }
    goto LAB_0014c006;
  }
  M.p._4_4_ = mbedtls_mpi_sub_abs((mbedtls_mpi *)local_88,(mbedtls_mpi *)local_88,&grp->P);
  goto joined_r0x0014bf66;
LAB_0014ba3d:
  M.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&U.p,&P->Y,&P->Y);
  if ((M.p._4_4_ == 0) && (M.p._4_4_ = ecp_modp((mbedtls_mpi *)&U.p,grp), M.p._4_4_ == 0)) {
    mul_count = mul_count + 1;
    M.p._4_4_ = mbedtls_mpi_shift_l((mbedtls_mpi *)&U.p,1);
    while (M.p._4_4_ == 0) {
      iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&U.p,&grp->P);
      if (iVar1 < 0) {
        M.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&T.p,&P->X,(mbedtls_mpi *)&U.p);
        if ((M.p._4_4_ == 0) && (M.p._4_4_ = ecp_modp((mbedtls_mpi *)&T.p,grp), M.p._4_4_ == 0)) {
          mul_count = mul_count + 1;
          M.p._4_4_ = mbedtls_mpi_shift_l((mbedtls_mpi *)&T.p,1);
          goto joined_r0x0014bb61;
        }
        break;
      }
      M.p._4_4_ = mbedtls_mpi_sub_abs((mbedtls_mpi *)&U.p,(mbedtls_mpi *)&U.p,&grp->P);
    }
  }
LAB_0014c006:
  mbedtls_mpi_free((mbedtls_mpi *)&S.p);
  mbedtls_mpi_free((mbedtls_mpi *)&T.p);
  mbedtls_mpi_free((mbedtls_mpi *)&U.p);
  mbedtls_mpi_free((mbedtls_mpi *)local_88);
  return M.p._4_4_;
}

Assistant:

static int ecp_double_jac( const mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                           const mbedtls_ecp_point *P )
{
    int ret;
    mbedtls_mpi M, S, T, U;

#if defined(MBEDTLS_SELF_TEST)
    dbl_count++;
#endif

    mbedtls_mpi_init( &M ); mbedtls_mpi_init( &S ); mbedtls_mpi_init( &T ); mbedtls_mpi_init( &U );

    /* Special case for A = -3 */
    if( grp->A.p == NULL )
    {
        /* M = 3(X + Z^2)(X - Z^2) */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &S,  &P->Z,  &P->Z   ) ); MOD_MUL( S );
        MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &T,  &P->X,  &S      ) ); MOD_ADD( T );
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &U,  &P->X,  &S      ) ); MOD_SUB( U );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &S,  &T,     &U      ) ); MOD_MUL( S );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &M,  &S,     3       ) ); MOD_ADD( M );
    }
    else
    {
        /* M = 3.X^2 */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &S,  &P->X,  &P->X   ) ); MOD_MUL( S );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &M,  &S,     3       ) ); MOD_ADD( M );

        /* Optimize away for "koblitz" curves with A = 0 */
        if( mbedtls_mpi_cmp_int( &grp->A, 0 ) != 0 )
        {
            /* M += A.Z^4 */
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &S,  &P->Z,  &P->Z   ) ); MOD_MUL( S );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T,  &S,     &S      ) ); MOD_MUL( T );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &S,  &T,     &grp->A ) ); MOD_MUL( S );
            MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &M,  &M,     &S      ) ); MOD_ADD( M );
        }
    }

    /* S = 4.X.Y^2 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T,  &P->Y,  &P->Y   ) ); MOD_MUL( T );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &T,  1               ) ); MOD_ADD( T );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &S,  &P->X,  &T      ) ); MOD_MUL( S );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &S,  1               ) ); MOD_ADD( S );

    /* U = 8.Y^4 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &U,  &T,     &T      ) ); MOD_MUL( U );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &U,  1               ) ); MOD_ADD( U );

    /* T = M^2 - 2.S */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T,  &M,     &M      ) ); MOD_MUL( T );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &T,  &T,     &S      ) ); MOD_SUB( T );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &T,  &T,     &S      ) ); MOD_SUB( T );

    /* S = M(S - T) - U */
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &S,  &S,     &T      ) ); MOD_SUB( S );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &S,  &S,     &M      ) ); MOD_MUL( S );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &S,  &S,     &U      ) ); MOD_SUB( S );

    /* U = 2.Y.Z */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &U,  &P->Y,  &P->Z   ) ); MOD_MUL( U );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &U,  1               ) ); MOD_ADD( U );

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->X, &T ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->Y, &S ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->Z, &U ) );

cleanup:
    mbedtls_mpi_free( &M ); mbedtls_mpi_free( &S ); mbedtls_mpi_free( &T ); mbedtls_mpi_free( &U );

    return( ret );
}